

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.c
# Opt level: O2

void CF_MEMTRACE_FREE(void *p,cf_char_t *file,cf_char_t *function,int line)

{
  uint __line;
  undefined8 *__ptr;
  char *__assertion;
  void *p_local;
  
  if (g_memchk_ctx.inited == 0) {
    return;
  }
  p_local = p;
  cf_mutex_lock(&g_memchk_ctx.mutex);
  __ptr = (undefined8 *)cf_hashtbl_get(g_memchk_ctx.alloc_info,&p_local,8);
  if (__ptr == (undefined8 *)0x0) {
    __assertion = "0";
    __line = 0x7a;
  }
  else {
    if ((ulong)__ptr[3] <= g_memchk_ctx.alloc_size) {
      g_memchk_ctx.alloc_size = g_memchk_ctx.alloc_size - __ptr[3];
      free((void *)*__ptr);
      free((void *)__ptr[1]);
      free(__ptr);
      cf_hashtbl_set(g_memchk_ctx.alloc_info,&p_local,8,(cf_void_t *)0x0);
      cf_mutex_unlock(&g_memchk_ctx.mutex);
      return;
    }
    __assertion = "g_memchk_ctx.alloc_size >= info->size";
    __line = 0x70;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/tkorays[P]CFAST/src/cf/memory.c"
                ,__line,"void CF_MEMTRACE_FREE(void *, const cf_char_t *, const cf_char_t *, int)");
}

Assistant:

void CF_MEMTRACE_FREE(void* p,
                      const cf_char_t* file,
                      const cf_char_t* function,
                      int line) {
    malloc_info* info;
    if (!g_memchk_ctx.inited) return;

    /* printf("free: %p, file: %s, func: %s, line: %d\n", p, file, function, line); */
    cf_mutex_lock(&g_memchk_ctx.mutex);

    info = CF_TYPE_CAST(malloc_info*, cf_hashtbl_get(g_memchk_ctx.alloc_info, &p, sizeof(void*)));
    if (info) {
        cf_assert(g_memchk_ctx.alloc_size >= info->size);
        g_memchk_ctx.alloc_size -= info->size;

        {
            cf_free_native((void*)info->location.file_name);
            cf_free_native((void*)info->location.function_name);
            cf_free_native(info);
        }
        cf_hashtbl_set(g_memchk_ctx.alloc_info, &p, sizeof(void*), CF_NULL_PTR);
    } else {
        cf_assert(CF_FALSE);
    }

    cf_mutex_unlock(&g_memchk_ctx.mutex);
}